

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

Kit_DsdNtk_t * Kit_DsdDecomposeMux(uint *pTruth,int nVars,int nDecMux)

{
  Kit_DsdObj_t **ppKVar1;
  int iVar2;
  uint uWord;
  Kit_DsdNtk_t *pNtk;
  Kit_DsdObj_t *pKVar3;
  unsigned_short *pPar;
  ulong uVar4;
  uint *pOut;
  ulong uVar5;
  
  if (0x10 < nVars) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                  ,0x8e1,"Kit_DsdNtk_t *Kit_DsdDecomposeInt(unsigned int *, int, int)");
  }
  pNtk = Kit_DsdNtkAlloc(nVars);
  uVar4 = 0;
  iVar2 = Abc_Var2Lit((uint)pNtk->nVars,0);
  pNtk->Root = (unsigned_short)iVar2;
  pKVar3 = Kit_DsdObjAlloc(pNtk,KIT_DSD_PRIME,nVars);
  ppKVar1 = pNtk->pNodes;
  if (*ppKVar1 == pKVar3) {
    pPar = &pNtk->Root;
    uVar5 = 0;
    if (0 < nVars) {
      uVar5 = (ulong)(uint)nVars;
    }
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      iVar2 = Abc_Var2Lit((int)uVar4,0);
      *(short *)(&pKVar3[1].field_0x0 + uVar4 * 2) = (short)iVar2;
    }
    pOut = (uint *)0x0;
    if (((uint)*pKVar3 & 0x1c0) == 0x140) {
      pOut = (uint *)(&pKVar3[1].field_0x0 + ((uint)*pKVar3 >> 8 & 0x3fc));
    }
    Kit_TruthCopy(pOut,pTruth,nVars);
    uWord = Kit_TruthSupport(pTruth,nVars);
    iVar2 = Kit_WordCountOnes(uWord);
    if (iVar2 == 1) {
      *pKVar3 = (Kit_DsdObj_t)((uint)*pKVar3 & 0x3fffe3f | 0x4000080);
      iVar2 = Kit_WordFindFirstBit(uWord);
      iVar2 = Abc_Var2Lit(iVar2,*pTruth & 1);
      *(short *)(pKVar3 + 1) = (short)iVar2;
    }
    else if (iVar2 == 0) {
      *pKVar3 = (Kit_DsdObj_t)((uint)*pKVar3 & 0x3fffe3f | 0x40);
      if (*pTruth == 0) {
        iVar2 = Abc_LitNot((uint)*pPar);
        *pPar = (unsigned_short)iVar2;
      }
    }
    else {
      Kit_DsdDecompose_rec(pNtk,*ppKVar1,uWord,pPar,nDecMux);
    }
    return pNtk;
  }
  __assert_fail("pNtk->pNodes[0] == pObj",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                ,0x8e6,"Kit_DsdNtk_t *Kit_DsdDecomposeInt(unsigned int *, int, int)");
}

Assistant:

Kit_DsdNtk_t *  Kit_DsdDecomposeMux( unsigned * pTruth, int nVars, int nDecMux )
{
/*
    Kit_DsdNtk_t * pNew;
    Kit_DsdObj_t * pObjNew;
    assert( nVars <= 16 );
    // create a new network
    pNew = Kit_DsdNtkAlloc( nVars );
    // consider simple special cases
    if ( nVars == 0 )
    {
        pObjNew = Kit_DsdObjAlloc( pNew, KIT_DSD_CONST1, 0 );
        pNew->Root = Abc_Var2Lit( pObjNew->Id, (int)(pTruth[0] == 0) );
        return pNew;
    }
    if ( nVars == 1 )
    {
        pObjNew = Kit_DsdObjAlloc( pNew, KIT_DSD_VAR, 1 );
        pObjNew->pFans[0] = Abc_Var2Lit( 0, 0 );
        pNew->Root = Abc_Var2Lit( pObjNew->Id, (int)(pTruth[0] != 0xAAAAAAAA) );
        return pNew;
    }
*/
    return Kit_DsdDecomposeInt( pTruth, nVars, nDecMux );
}